

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SNMPTrap.cpp
# Opt level: O0

shared_ptr<ComplexType> __thiscall SNMPTrap::generateVarBindList(SNMPTrap *this)

{
  bool bVar1;
  element_type *peVar2;
  reference ppVVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long in_RSI;
  shared_ptr<ComplexType> sVar4;
  shared_ptr<BER_CONTAINER> local_260;
  undefined1 local_250 [16];
  undefined1 local_240 [16];
  undefined1 local_230 [16];
  undefined1 local_220 [32];
  undefined1 local_200 [24];
  undefined1 local_1e8 [8];
  shared_ptr<ComplexType> varBind;
  ValueCallback *value;
  iterator __end1;
  iterator __begin1;
  list<ValueCallback_*,_std::allocator<ValueCallback_*>_> *__range1;
  undefined1 local_1a8 [16];
  undefined1 local_198 [32];
  undefined1 local_178 [16];
  undefined1 local_168 [32];
  undefined1 local_148 [24];
  undefined1 local_130 [8];
  shared_ptr<ComplexType> oidVarBind;
  undefined1 local_110 [40];
  shared_ptr<BER_CONTAINER> local_e8;
  undefined1 local_d8 [16];
  undefined1 local_c8 [32];
  shared_ptr<BER_CONTAINER> local_a8;
  undefined1 local_98 [16];
  undefined1 local_88 [32];
  ComplexType local_68;
  undefined1 local_40 [8];
  shared_ptr<ComplexType> timestampVarBind;
  undefined1 local_28 [8];
  shared_ptr<ComplexType> ourVBList;
  SNMPTrap *this_local;
  
  timestampVarBind.super___shared_ptr<ComplexType,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
  _4_4_ = 0x30;
  std::make_shared<ComplexType,ASN_TYPE_WITH_VALUE>((ASN_TYPE_WITH_VALUE *)local_28);
  if (*(int *)(in_RSI + 0x48) == 1) {
    if (*(long *)(in_RSI + 0xe8) == 0) {
      std::shared_ptr<ComplexType>::shared_ptr((shared_ptr<ComplexType> *)this,(nullptr_t)0x0);
      goto LAB_001fe304;
    }
    local_68.values.
    super__Vector_base<std::shared_ptr<BER_CONTAINER>,_std::allocator<std::shared_ptr<BER_CONTAINER>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0x30;
    std::make_shared<ComplexType,ASN_TYPE_WITH_VALUE>((ASN_TYPE_WITH_VALUE *)local_40);
    peVar2 = std::__shared_ptr_access<ComplexType,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<ComplexType,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_40);
    OIDType::cloneOID((OIDType *)local_88);
    std::shared_ptr<BER_CONTAINER>::shared_ptr<OIDType,void>
              ((shared_ptr<BER_CONTAINER> *)(local_88 + 0x10),(shared_ptr<OIDType> *)local_88);
    ComplexType::addValueToList(&local_68,(shared_ptr<BER_CONTAINER> *)peVar2);
    Catch::clara::std::shared_ptr<BER_CONTAINER>::~shared_ptr
              ((shared_ptr<BER_CONTAINER> *)&local_68);
    Catch::clara::std::shared_ptr<BER_CONTAINER>::~shared_ptr
              ((shared_ptr<BER_CONTAINER> *)(local_88 + 0x10));
    Catch::clara::std::shared_ptr<OIDType>::~shared_ptr((shared_ptr<OIDType> *)local_88);
    if (*(long *)(in_RSI + 0xf0) == 0) {
      peVar2 = std::__shared_ptr_access<ComplexType,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<ComplexType,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_40);
      local_110._20_4_ = 0;
      std::make_shared<TimestampType,int>((int *)(local_110 + 0x18));
      std::shared_ptr<BER_CONTAINER>::shared_ptr<TimestampType,void>
                (&local_e8,(shared_ptr<TimestampType> *)(local_110 + 0x18));
      ComplexType::addValueToList((ComplexType *)local_d8,(shared_ptr<BER_CONTAINER> *)peVar2);
      Catch::clara::std::shared_ptr<BER_CONTAINER>::~shared_ptr
                ((shared_ptr<BER_CONTAINER> *)local_d8);
      Catch::clara::std::shared_ptr<BER_CONTAINER>::~shared_ptr
                ((shared_ptr<BER_CONTAINER> *)&local_e8);
      std::shared_ptr<TimestampType>::~shared_ptr((shared_ptr<TimestampType> *)(local_110 + 0x18));
    }
    else {
      peVar2 = std::__shared_ptr_access<ComplexType,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<ComplexType,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_40);
      ValueCallback::getValueForCallback
                ((ValueCallback *)local_c8,*(ValueCallback **)(in_RSI + 0xf0));
      std::static_pointer_cast<TimestampType,BER_CONTAINER>
                ((shared_ptr<BER_CONTAINER> *)(local_c8 + 0x10));
      std::shared_ptr<BER_CONTAINER>::shared_ptr<TimestampType,void>
                (&local_a8,(shared_ptr<TimestampType> *)(local_c8 + 0x10));
      ComplexType::addValueToList((ComplexType *)local_98,(shared_ptr<BER_CONTAINER> *)peVar2);
      Catch::clara::std::shared_ptr<BER_CONTAINER>::~shared_ptr
                ((shared_ptr<BER_CONTAINER> *)local_98);
      Catch::clara::std::shared_ptr<BER_CONTAINER>::~shared_ptr
                ((shared_ptr<BER_CONTAINER> *)&local_a8);
      std::shared_ptr<TimestampType>::~shared_ptr((shared_ptr<TimestampType> *)(local_c8 + 0x10));
      Catch::clara::std::shared_ptr<BER_CONTAINER>::~shared_ptr
                ((shared_ptr<BER_CONTAINER> *)local_c8);
    }
    peVar2 = std::__shared_ptr_access<ComplexType,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<ComplexType,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_28);
    std::shared_ptr<BER_CONTAINER>::shared_ptr<ComplexType,void>
              ((shared_ptr<BER_CONTAINER> *)
               &oidVarBind.super___shared_ptr<ComplexType,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               (shared_ptr<ComplexType> *)local_40);
    ComplexType::addValueToList((ComplexType *)local_110,(shared_ptr<BER_CONTAINER> *)peVar2);
    Catch::clara::std::shared_ptr<BER_CONTAINER>::~shared_ptr
              ((shared_ptr<BER_CONTAINER> *)local_110);
    Catch::clara::std::shared_ptr<BER_CONTAINER>::~shared_ptr
              ((shared_ptr<BER_CONTAINER> *)
               &oidVarBind.super___shared_ptr<ComplexType,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    local_148._20_4_ = 0x30;
    std::make_shared<ComplexType,ASN_TYPE_WITH_VALUE>((ASN_TYPE_WITH_VALUE *)local_130);
    peVar2 = std::__shared_ptr_access<ComplexType,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<ComplexType,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_130);
    OIDType::cloneOID((OIDType *)local_168);
    std::shared_ptr<BER_CONTAINER>::shared_ptr<OIDType,void>
              ((shared_ptr<BER_CONTAINER> *)(local_168 + 0x10),(shared_ptr<OIDType> *)local_168);
    ComplexType::addValueToList((ComplexType *)local_148,(shared_ptr<BER_CONTAINER> *)peVar2);
    Catch::clara::std::shared_ptr<BER_CONTAINER>::~shared_ptr
              ((shared_ptr<BER_CONTAINER> *)local_148);
    Catch::clara::std::shared_ptr<BER_CONTAINER>::~shared_ptr
              ((shared_ptr<BER_CONTAINER> *)(local_168 + 0x10));
    Catch::clara::std::shared_ptr<OIDType>::~shared_ptr((shared_ptr<OIDType> *)local_168);
    peVar2 = std::__shared_ptr_access<ComplexType,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<ComplexType,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_130);
    OIDType::cloneOID((OIDType *)local_198);
    std::shared_ptr<BER_CONTAINER>::shared_ptr<OIDType,void>
              ((shared_ptr<BER_CONTAINER> *)(local_198 + 0x10),(shared_ptr<OIDType> *)local_198);
    ComplexType::addValueToList((ComplexType *)local_178,(shared_ptr<BER_CONTAINER> *)peVar2);
    Catch::clara::std::shared_ptr<BER_CONTAINER>::~shared_ptr
              ((shared_ptr<BER_CONTAINER> *)local_178);
    Catch::clara::std::shared_ptr<BER_CONTAINER>::~shared_ptr
              ((shared_ptr<BER_CONTAINER> *)(local_198 + 0x10));
    Catch::clara::std::shared_ptr<OIDType>::~shared_ptr((shared_ptr<OIDType> *)local_198);
    peVar2 = std::__shared_ptr_access<ComplexType,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<ComplexType,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_28);
    std::shared_ptr<BER_CONTAINER>::shared_ptr<ComplexType,void>
              ((shared_ptr<BER_CONTAINER> *)&__range1,(shared_ptr<ComplexType> *)local_130);
    ComplexType::addValueToList((ComplexType *)local_1a8,(shared_ptr<BER_CONTAINER> *)peVar2);
    Catch::clara::std::shared_ptr<BER_CONTAINER>::~shared_ptr
              ((shared_ptr<BER_CONTAINER> *)local_1a8);
    Catch::clara::std::shared_ptr<BER_CONTAINER>::~shared_ptr
              ((shared_ptr<BER_CONTAINER> *)&__range1);
    std::shared_ptr<ComplexType>::~shared_ptr((shared_ptr<ComplexType> *)local_130);
    std::shared_ptr<ComplexType>::~shared_ptr((shared_ptr<ComplexType> *)local_40);
  }
  __end1 = std::__cxx11::list<ValueCallback_*,_std::allocator<ValueCallback_*>_>::begin
                     ((list<ValueCallback_*,_std::allocator<ValueCallback_*>_> *)(in_RSI + 0x108));
  value = (ValueCallback *)
          std::__cxx11::list<ValueCallback_*,_std::allocator<ValueCallback_*>_>::end
                    ((list<ValueCallback_*,_std::allocator<ValueCallback_*>_> *)(in_RSI + 0x108));
  while (bVar1 = std::operator!=(&__end1,(_Self *)&value), bVar1) {
    ppVVar3 = std::_List_iterator<ValueCallback_*>::operator*(&__end1);
    varBind.super___shared_ptr<ComplexType,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*ppVVar3;
    if ((ValueCallback *)
        varBind.super___shared_ptr<ComplexType,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (ValueCallback *)0x0) {
      local_200._20_4_ = 0x30;
      std::make_shared<ComplexType,ASN_TYPE_WITH_VALUE>((ASN_TYPE_WITH_VALUE *)local_1e8);
      peVar2 = std::__shared_ptr_access<ComplexType,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<ComplexType,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_1e8);
      OIDType::cloneOID((OIDType *)local_220);
      std::shared_ptr<BER_CONTAINER>::shared_ptr<OIDType,void>
                ((shared_ptr<BER_CONTAINER> *)(local_220 + 0x10),(shared_ptr<OIDType> *)local_220);
      ComplexType::addValueToList((ComplexType *)local_200,(shared_ptr<BER_CONTAINER> *)peVar2);
      Catch::clara::std::shared_ptr<BER_CONTAINER>::~shared_ptr
                ((shared_ptr<BER_CONTAINER> *)local_200);
      Catch::clara::std::shared_ptr<BER_CONTAINER>::~shared_ptr
                ((shared_ptr<BER_CONTAINER> *)(local_220 + 0x10));
      Catch::clara::std::shared_ptr<OIDType>::~shared_ptr((shared_ptr<OIDType> *)local_220);
      peVar2 = std::__shared_ptr_access<ComplexType,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<ComplexType,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_1e8);
      ValueCallback::getValueForCallback
                ((ValueCallback *)local_240,
                 (ValueCallback *)
                 varBind.super___shared_ptr<ComplexType,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
      ComplexType::addValueToList((ComplexType *)local_230,(shared_ptr<BER_CONTAINER> *)peVar2);
      Catch::clara::std::shared_ptr<BER_CONTAINER>::~shared_ptr
                ((shared_ptr<BER_CONTAINER> *)local_230);
      Catch::clara::std::shared_ptr<BER_CONTAINER>::~shared_ptr
                ((shared_ptr<BER_CONTAINER> *)local_240);
      peVar2 = std::__shared_ptr_access<ComplexType,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<ComplexType,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_28);
      std::shared_ptr<BER_CONTAINER>::shared_ptr<ComplexType,void>
                (&local_260,(shared_ptr<ComplexType> *)local_1e8);
      ComplexType::addValueToList((ComplexType *)local_250,(shared_ptr<BER_CONTAINER> *)peVar2);
      Catch::clara::std::shared_ptr<BER_CONTAINER>::~shared_ptr
                ((shared_ptr<BER_CONTAINER> *)local_250);
      Catch::clara::std::shared_ptr<BER_CONTAINER>::~shared_ptr
                ((shared_ptr<BER_CONTAINER> *)&local_260);
      std::shared_ptr<ComplexType>::~shared_ptr((shared_ptr<ComplexType> *)local_1e8);
    }
    std::_List_iterator<ValueCallback_*>::operator++(&__end1);
  }
  std::shared_ptr<ComplexType>::shared_ptr
            ((shared_ptr<ComplexType> *)this,(shared_ptr<ComplexType> *)local_28);
LAB_001fe304:
  timestampVarBind.super___shared_ptr<ComplexType,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
  _0_4_ = 1;
  std::shared_ptr<ComplexType>::~shared_ptr((shared_ptr<ComplexType> *)local_28);
  sVar4.super___shared_ptr<ComplexType,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar4.super___shared_ptr<ComplexType,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<ComplexType>)sVar4.super___shared_ptr<ComplexType,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<ComplexType> SNMPTrap::generateVarBindList(){
    SNMP_LOGD("generateVarBindList from SNMPTrap");
    auto ourVBList = std::make_shared<ComplexType>(STRUCTURE);
    // If we're an SNMPv2 Trap, our first two are timestamp and OIDType, v1 already has them included
    if(this->snmpVersion == SNMP_VERSION_2C){
        if(!this->trapOID){
            return nullptr;
        }
        // Timestamp
        auto timestampVarBind = std::make_shared<ComplexType>(STRUCTURE);
        timestampVarBind->addValueToList(timestampOID->cloneOID());

        if(uptimeCallback){
            timestampVarBind->addValueToList(std::static_pointer_cast<TimestampType>(ValueCallback::getValueForCallback(uptimeCallback)));
        } else {
            timestampVarBind->addValueToList(std::make_shared<TimestampType>(0));
        }
        ourVBList->addValueToList(timestampVarBind);

        // OID
        auto oidVarBind = std::make_shared<ComplexType>(STRUCTURE);
        oidVarBind->addValueToList(snmpTrapOID->cloneOID());
        oidVarBind->addValueToList(trapOID->cloneOID());
        ourVBList->addValueToList(oidVarBind);
    }

    for(auto value : this->callbacks){
        if(!value) continue;
        auto varBind = std::make_shared<ComplexType>(STRUCTURE);

        varBind->addValueToList(value->OID->cloneOID());
        varBind->addValueToList(ValueCallback::getValueForCallback(value));

        ourVBList->addValueToList(varBind);
    }

    return ourVBList;
}